

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::ConvertSpanToBezier
          (ON_NurbsSurface *this,int span_index0,int span_index1,ON_BezierSurface *bezier_surface)

{
  bool bVar1;
  double *pdVar2;
  double *__src;
  int iVar3;
  bool bClamp;
  int sizeof_cv;
  undefined1 local_88 [8];
  ON_NurbsSurface bispan;
  int j;
  int i;
  ON_BezierSurface *bezier_surface_local;
  int span_index1_local;
  int span_index0_local;
  ON_NurbsSurface *this_local;
  
  if (((this->m_cv == (double *)0x0) || (this->m_knot[0] == (double *)0x0)) ||
     (this->m_knot[1] == (double *)0x0)) {
    this_local._7_1_ = false;
  }
  else if ((span_index0 < 0) || (this->m_cv_count[0] - this->m_order[0] < span_index0)) {
    this_local._7_1_ = false;
  }
  else if ((span_index1 < 0) || (this->m_cv_count[1] - this->m_order[1] < span_index1)) {
    this_local._7_1_ = false;
  }
  else {
    iVar3 = span_index0 + this->m_order[0];
    bispan.m_cv._4_4_ = iVar3 + -2;
    if (this->m_knot[0][bispan.m_cv._4_4_] < this->m_knot[0][iVar3 + -1]) {
      iVar3 = span_index1 + this->m_order[1];
      bispan.m_cv._0_4_ = iVar3 + -2;
      if (this->m_knot[1][(int)bispan.m_cv] < this->m_knot[1][iVar3 + -1]) {
        ON_NurbsSurface((ON_NurbsSurface *)local_88);
        bispan._72_8_ = bezier_surface->m_cv;
        bispan.m_cv_stride[0] = bezier_surface->m_cv_capacity;
        Create((ON_NurbsSurface *)local_88,this->m_dim,this->m_is_rat != 0,this->m_order[0],
               this->m_order[1],this->m_order[0],this->m_order[1]);
        iVar3 = CVSize(this);
        for (bispan.m_cv._4_4_ = 0; bispan.m_cv._4_4_ < this->m_order[0];
            bispan.m_cv._4_4_ = bispan.m_cv._4_4_ + 1) {
          for (bispan.m_cv._0_4_ = 0; (int)bispan.m_cv < this->m_order[1];
              bispan.m_cv._0_4_ = (int)bispan.m_cv + 1) {
            pdVar2 = CV((ON_NurbsSurface *)local_88,bispan.m_cv._4_4_,(int)bispan.m_cv);
            __src = CV(this,span_index0 + bispan.m_cv._4_4_,span_index1 + (int)bispan.m_cv);
            memcpy(pdVar2,__src,(long)(iVar3 << 3));
          }
        }
        bispan.m_cv._4_4_ = span_index0 + this->m_order[0] + -2;
        bispan.m_cv._0_4_ = span_index1 + this->m_order[1] + -2;
        bVar1 = false;
        if ((this->m_knot[0][span_index0] != this->m_knot[0][span_index0 + this->m_order[0] + -2])
           || (NAN(this->m_knot[0][span_index0]) ||
               NAN(this->m_knot[0][span_index0 + this->m_order[0] + -2]))) {
          bVar1 = true;
        }
        if ((this->m_knot[0][span_index0 + this->m_order[0] + -1] !=
             this->m_knot[0][span_index0 + this->m_order[0] * 2 + -3]) ||
           (NAN(this->m_knot[0][span_index0 + this->m_order[0] + -1]) ||
            NAN(this->m_knot[0][span_index0 + this->m_order[0] * 2 + -3]))) {
          bVar1 = true;
        }
        if ((this->m_knot[1][span_index1] != this->m_knot[1][span_index1 + this->m_order[1] + -2])
           || (NAN(this->m_knot[1][span_index1]) ||
               NAN(this->m_knot[1][span_index1 + this->m_order[1] + -2]))) {
          bVar1 = true;
        }
        if ((this->m_knot[1][span_index1 + this->m_order[1] + -1] !=
             this->m_knot[1][span_index1 + this->m_order[1] * 2 + -3]) ||
           (NAN(this->m_knot[1][span_index1 + this->m_order[1] + -1]) ||
            NAN(this->m_knot[1][span_index1 + this->m_order[1] * 2 + -3]))) {
          bVar1 = true;
        }
        if (bVar1) {
          pdVar2 = this->m_knot[0];
          iVar3 = KnotCount((ON_NurbsSurface *)local_88,0);
          memcpy((void *)bispan.m_knot_capacity,pdVar2 + span_index0,(long)iVar3 << 3);
          pdVar2 = this->m_knot[1];
          iVar3 = KnotCount((ON_NurbsSurface *)local_88,1);
          memcpy(bispan.m_knot[0],pdVar2 + span_index1,(long)iVar3 << 3);
          ClampEnd((ON_NurbsSurface *)local_88,1,2);
          ClampEnd((ON_NurbsSurface *)local_88,0,2);
        }
        bezier_surface->m_dim =
             (int)bispan.super_ON_Surface.super_ON_Geometry.super_ON_Object.m_userdata_list;
        bezier_surface->m_is_rat =
             bispan.super_ON_Surface.super_ON_Geometry.super_ON_Object.m_userdata_list._4_4_;
        bezier_surface->m_order[0] = bispan.m_dim;
        bezier_surface->m_order[1] = bispan.m_is_rat;
        bezier_surface->m_cv_stride[0] = (int)bispan.m_knot[1];
        bezier_surface->m_cv_stride[1] = bispan.m_knot[1]._4_4_;
        bezier_surface->m_cv = (double *)bispan._72_8_;
        bezier_surface->m_cv_capacity = bispan.m_cv_stride[0];
        bispan.m_cv_capacity = 0;
        bispan._76_4_ = 0;
        bispan.m_cv_stride[0] = 0;
        ~ON_NurbsSurface((ON_NurbsSurface *)local_88);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::ConvertSpanToBezier(
    int span_index0,
    int span_index1, 
    ON_BezierSurface& bezier_surface
    ) const
{
  int i, j;
  if ( !m_cv || !m_knot[0] || !m_knot[1] )
    return false;
  if ( span_index0 < 0 ||  span_index0 > m_cv_count[0]-m_order[0] )
    return false;
  if ( span_index1 < 0 ||  span_index1 > m_cv_count[1]-m_order[1] )
    return false;
  i = span_index0+m_order[0]-2;
  if ( m_knot[0][i] >= m_knot[0][i+1] )
    return false;
  j = span_index1+m_order[1]-2;
  if ( m_knot[1][j] >= m_knot[1][j+1] )
    return false;
  {
    ON_NurbsSurface bispan;
    bispan.m_cv = bezier_surface.m_cv;
    bispan.m_cv_capacity = bezier_surface.m_cv_capacity;
    bispan.Create( m_dim, m_is_rat, m_order[0], m_order[1], m_order[0], m_order[1] );
    const int sizeof_cv = CVSize()*sizeof(*bispan.m_cv);
    for ( i = 0; i < m_order[0]; i++ ) for ( j = 0; j < m_order[1]; j++ )
    {
      memcpy( bispan.CV(i,j), CV(span_index0+i,span_index1+j), sizeof_cv ); 
    }
    i = span_index0+m_order[0]-2;
    j = span_index1+m_order[1]-2;
    bool bClamp = false;
    if ( m_knot[0][span_index0] != m_knot[0][span_index0+m_order[0]-2] )
      bClamp = true;
    if ( m_knot[0][span_index0+m_order[0]-1] != m_knot[0][span_index0+2*m_order[0]-3] )
      bClamp = true;
    if ( m_knot[1][span_index1] != m_knot[1][span_index1+m_order[1]-2] )
      bClamp = true;
    if ( m_knot[1][span_index1+m_order[1]-1] != m_knot[1][span_index1+2*m_order[1]-3] )
      bClamp = true;
    if ( bClamp )
    {
      memcpy( bispan.m_knot[0], m_knot[0]+span_index0, bispan.KnotCount(0)*sizeof(bispan.m_knot[0][0]) );
      memcpy( bispan.m_knot[1], m_knot[1]+span_index1, bispan.KnotCount(1)*sizeof(bispan.m_knot[1][0]) );
      bispan.ClampEnd(1,2);
      bispan.ClampEnd(0,2);
    }
    bezier_surface.m_dim = bispan.m_dim;
    bezier_surface.m_is_rat = bispan.m_is_rat;
    bezier_surface.m_order[0] = bispan.m_order[0];
    bezier_surface.m_order[1] = bispan.m_order[1];
    bezier_surface.m_cv_stride[0] = bispan.m_cv_stride[0];
    bezier_surface.m_cv_stride[1] = bispan.m_cv_stride[1];
    bezier_surface.m_cv = bispan.m_cv;
    bezier_surface.m_cv_capacity = bispan.m_cv_capacity;
    bispan.m_cv = 0;
    bispan.m_cv_capacity = 0;
  }
  return true;
}